

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListPushBack(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  _xmlLink *p_Var2;
  xmlLinkPtr lkNew;
  xmlLinkPtr lkPlace;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local._4_4_ = 0;
  }
  else {
    p_Var1 = l->sentinel->prev;
    p_Var2 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var2 == (_xmlLink *)0x0) {
      l_local._4_4_ = 0;
    }
    else {
      p_Var2->data = data;
      p_Var2->next = p_Var1->next;
      p_Var1->next->prev = p_Var2;
      p_Var1->next = p_Var2;
      p_Var2->prev = p_Var1;
      l_local._4_4_ = 1;
    }
  }
  return l_local._4_4_;
}

Assistant:

int
xmlListPushBack(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(0);
    lkPlace = l->sentinel->prev;
    /* Add the new link */
    lkNew = (xmlLinkPtr)xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL)
        return (0);
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 1;
}